

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

void calculate_path_table_size(vdd *vdd)

{
  uint uVar1;
  isoent *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  if ((long)vdd->max_depth < 1) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      uVar1 = vdd->pathtbl[lVar5].cnt;
      if ((ulong)uVar1 == 0) break;
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          piVar2 = vdd->pathtbl[lVar5].sorted[uVar6];
          if (piVar2->identifier == (char *)0x0) {
            uVar7 = 1;
          }
          else {
            uVar7 = piVar2->id_len;
          }
          iVar3 = iVar3 + uVar7 + (uVar7 & 1) + 8;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != vdd->max_depth);
  }
  vdd->path_table_size = iVar3;
  iVar4 = iVar3 + 0x1ffe;
  if (-1 < iVar3 + 0xfff) {
    iVar4 = iVar3 + 0xfff;
  }
  vdd->path_table_block = (iVar4 >> 0xc) * 2;
  return;
}

Assistant:

static void
calculate_path_table_size(struct vdd *vdd)
{
	int depth, size;
	struct path_table *pt;

	pt = vdd->pathtbl;
	size = 0;
	for (depth = 0; depth < vdd->max_depth; depth++) {
		struct isoent **ptbl;
		int i, cnt;

		if ((cnt = pt[depth].cnt) == 0)
			break;

		ptbl = pt[depth].sorted;
		for (i = 0; i < cnt; i++) {
			int len;

			if (ptbl[i]->identifier == NULL)
				len = 1; /* root directory */
			else
				len = ptbl[i]->id_len;
			if (len & 0x01)
				len++; /* Padding Field */
			size += 8 + len;
		}
	}
	vdd->path_table_size = size;
	vdd->path_table_block =
	    ((size + PATH_TABLE_BLOCK_SIZE -1) /
	    PATH_TABLE_BLOCK_SIZE) *
	    (PATH_TABLE_BLOCK_SIZE / LOGICAL_BLOCK_SIZE);
}